

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O0

void __thiscall so_5::impl::disp_repository_t::start(disp_repository_t *this)

{
  bool bVar1;
  pointer ppVar2;
  element_type *peVar3;
  _Self local_28;
  iterator it_end;
  iterator it;
  lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_> lock;
  disp_repository_t *this_local;
  
  std::lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_>::lock_guard
            ((lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_> *)&it,&this->m_lock);
  if (this->m_state == not_started) {
    it_end = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
             ::begin(&this->m_named_dispatcher_map);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
         ::end(&this->m_named_dispatcher_map);
    while( true ) {
      bVar1 = std::operator!=(&it_end,&local_28);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>
               ::operator->(&it_end);
      peVar3 = std::
               __shared_ptr_access<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&ppVar2->second);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>
               ::operator->(&it_end);
      (*peVar3->_vptr_dispatcher_t[5])(peVar3,ppVar2);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>
               ::operator->(&it_end);
      peVar3 = std::
               __shared_ptr_access<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&ppVar2->second);
      (*peVar3->_vptr_dispatcher_t[2])(peVar3,this->m_env);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>
      ::operator++(&it_end);
    }
    this->m_state = started;
  }
  std::lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_>::~lock_guard
            ((lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_> *)&it);
  return;
}

Assistant:

void
disp_repository_t::start()
{
	std::lock_guard< default_rw_spinlock_t > lock( m_lock );
	if( state_t::not_started == m_state )
	{
		auto it = m_named_dispatcher_map.begin();
		auto it_end = m_named_dispatcher_map.end();

		for( ; it != it_end; ++it )
		{
			it->second->set_data_sources_name_base( it->first );
			it->second->start( m_env );
		}

		m_state = state_t::started;
	}
}